

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

aiFace __thiscall Assimp::D3MF::XmlSerializer::ReadTriangle(XmlSerializer *this)

{
  int iVar1;
  pointer pMVar2;
  char *pcVar3;
  uint *extraout_RDX;
  long in_RSI;
  aiFace aVar4;
  
  (this->mMetaData).
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &(this->mMetaData).
    super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = 3;
  pMVar2 = (pointer)operator_new__(0xc);
  (this->mMetaData).
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  pcVar3 = (char *)(**(code **)(**(long **)(in_RSI + 0x80) + 0x38))
                             (*(long **)(in_RSI + 0x80),XmlTag::v1_abi_cxx11_);
  iVar1 = atoi(pcVar3);
  *(int *)&(pMVar2->name)._M_dataplus._M_p = iVar1;
  pcVar3 = (char *)(**(code **)(**(long **)(in_RSI + 0x80) + 0x38))
                             (*(long **)(in_RSI + 0x80),XmlTag::v2_abi_cxx11_);
  iVar1 = atoi(pcVar3);
  *(int *)((long)&(pMVar2->name)._M_dataplus._M_p + 4) = iVar1;
  pcVar3 = (char *)(**(code **)(**(long **)(in_RSI + 0x80) + 0x38))
                             (*(long **)(in_RSI + 0x80),XmlTag::v3_abi_cxx11_);
  iVar1 = atoi(pcVar3);
  *(int *)&(pMVar2->name)._M_string_length = iVar1;
  aVar4.mIndices = extraout_RDX;
  aVar4._0_8_ = this;
  return aVar4;
}

Assistant:

aiFace ReadTriangle() {
        aiFace face;

        face.mNumIndices = 3;
        face.mIndices = new unsigned int[face.mNumIndices];
        face.mIndices[0] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v1.c_str())));
        face.mIndices[1] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v2.c_str())));
        face.mIndices[2] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v3.c_str())));

        return face;
    }